

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_58bb::Main_getInstance_Test::TestBody(Main_getInstance_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_48 [3];
  Message local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  Main *instance;
  Main_getInstance_Test *this_local;
  
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Main::getInstance();
  testing::internal::EqHelper<false>::Compare<Main*,Main*>
            ((EqHelper<false> *)local_28,"instance","Main::instance",(Main **)&gtest_ar.message_,
             &Main::instance);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_30);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              (local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/DanRuta[P]webassembly-workflow/test/cpp-tests.cpp"
               ,0x2f,message);
    testing::internal::AssertHelper::operator=(local_48,&local_30);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    testing::Message::~Message(&local_30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  return;
}

Assistant:

TEST(Main, getInstance) {
        Main* instance = Main::getInstance();
        EXPECT_EQ(instance, Main::instance);
    }